

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facenet.cpp
# Opt level: O0

void __thiscall
facenet::Inception_resnet_C(facenet *this,pBox *input,pBox *output,string *filepath,float scale)

{
  pBox *this_00;
  pBox *this_01;
  pBox *this_02;
  pBox *this_03;
  pBox *this_04;
  pBox *this_05;
  Weight *weight;
  Weight *weight_00;
  Weight *weight_01;
  Weight *weight_02;
  Weight *weight_03;
  Weight *weight_04;
  BN *var;
  BN *mean;
  BN *beta;
  BN *var_00;
  BN *mean_00;
  BN *beta_00;
  BN *var_01;
  BN *mean_01;
  BN *beta_01;
  BN *var_02;
  BN *mean_02;
  BN *beta_02;
  mydataFmt *pmVar1;
  string local_288;
  mydataFmt *local_268;
  mydataFmt *pointTeam [20];
  long dataNumber [20];
  long conv6;
  long conv5;
  long conv4;
  long conv3;
  long conv2;
  long conv1;
  BN *conv4_beta;
  BN *conv4_mean;
  BN *conv4_var;
  BN *conv3_beta;
  BN *conv3_mean;
  BN *conv3_var;
  BN *conv2_beta;
  BN *conv2_mean;
  BN *conv2_var;
  BN *conv1_beta;
  BN *conv1_mean;
  BN *conv1_var;
  Weight *conv6_wb;
  Weight *conv5_wb;
  Weight *conv4_wb;
  Weight *conv3_wb;
  Weight *conv2_wb;
  Weight *conv1_wb;
  pBox *conv6_out;
  pBox *conv5_out;
  pBox *conv4_out;
  pBox *conv3_out;
  pBox *conv2_out;
  pBox *conv1_out;
  float scale_local;
  string *filepath_local;
  pBox *output_local;
  pBox *input_local;
  facenet *this_local;
  
  this_00 = (pBox *)operator_new(0x38);
  pBox::pBox(this_00);
  this_01 = (pBox *)operator_new(0x38);
  pBox::pBox(this_01);
  this_02 = (pBox *)operator_new(0x38);
  pBox::pBox(this_02);
  this_03 = (pBox *)operator_new(0x38);
  pBox::pBox(this_03);
  this_04 = (pBox *)operator_new(0x38);
  pBox::pBox(this_04);
  this_05 = (pBox *)operator_new(0x38);
  pBox::pBox(this_05);
  weight = (Weight *)operator_new(0x38);
  weight_00 = (Weight *)operator_new(0x38);
  weight_01 = (Weight *)operator_new(0x38);
  weight_02 = (Weight *)operator_new(0x38);
  weight_03 = (Weight *)operator_new(0x38);
  weight_04 = (Weight *)operator_new(0x38);
  var = (BN *)operator_new(0x10);
  mean = (BN *)operator_new(0x10);
  beta = (BN *)operator_new(0x10);
  var_00 = (BN *)operator_new(0x10);
  mean_00 = (BN *)operator_new(0x10);
  beta_00 = (BN *)operator_new(0x10);
  var_01 = (BN *)operator_new(0x10);
  mean_01 = (BN *)operator_new(0x10);
  beta_01 = (BN *)operator_new(0x10);
  var_02 = (BN *)operator_new(0x10);
  mean_02 = (BN *)operator_new(0x10);
  beta_02 = (BN *)operator_new(0x10);
  pmVar1 = (mydataFmt *)ConvAndFcInit(weight,0xc0,0x700,1,1,0,0,0,0,0);
  BatchNormInit(beta,mean,var,0xc0);
  ConvAndFcInit(weight_00,0xc0,0x700,1,1,0,0,0,0,0);
  BatchNormInit(beta_00,mean_00,var_00,0xc0);
  ConvAndFcInit(weight_01,0xc0,0xc0,0,1,-1,3,1,1,0);
  BatchNormInit(beta_01,mean_01,var_01,0xc0);
  ConvAndFcInit(weight_02,0xc0,0xc0,0,1,-1,1,3,0,1);
  BatchNormInit(beta_02,mean_02,var_02,0xc0);
  ConvAndFcInit(weight_03,0x700,0x180,1,1,0,0,0,0,0);
  ConvAndFcInit(weight_04,0x700,0,0,0,0,0,0,0,0);
  local_268 = weight->pdata;
  pointTeam[0] = beta->pdata;
  pointTeam[1] = mean->pdata;
  pointTeam[2] = var->pdata;
  pointTeam[3] = weight_00->pdata;
  pointTeam[4] = beta_00->pdata;
  pointTeam[5] = mean_00->pdata;
  pointTeam[6] = var_00->pdata;
  pointTeam[7] = weight_01->pdata;
  pointTeam[8] = beta_01->pdata;
  pointTeam[9] = mean_01->pdata;
  pointTeam[10] = var_01->pdata;
  pointTeam[0xb] = weight_02->pdata;
  pointTeam[0xc] = beta_02->pdata;
  pointTeam[0xd] = mean_02->pdata;
  pointTeam[0xe] = var_02->pdata;
  pointTeam[0xf] = weight_03->pdata;
  pointTeam[0x10] = weight_03->pbias;
  pointTeam[0x11] = weight_04->pdata;
  pointTeam[0x12] = weight_04->pbias;
  pointTeam[0x13] = pmVar1;
  std::__cxx11::string::string((string *)&local_288,(string *)filepath);
  readData(&local_288,(long *)(pointTeam + 0x13),&local_268,0x14);
  std::__cxx11::string::~string((string *)&local_288);
  convolutionInit(weight,input,this_00);
  convolution(weight,input,this_00);
  BatchNorm(this_00,beta,mean,var);
  relu(this_00,weight->pbias);
  convolutionInit(weight_00,input,this_01);
  convolution(weight_00,input,this_01);
  BatchNorm(this_01,beta_00,mean_00,var_00);
  relu(this_01,weight_00->pbias);
  convolutionInit(weight_01,this_01,this_02);
  convolution(weight_01,this_01,this_02);
  BatchNorm(this_02,beta_01,mean_01,var_01);
  relu(this_02,weight_01->pbias);
  convolutionInit(weight_02,this_02,this_03);
  convolution(weight_02,this_02,this_03);
  BatchNorm(this_03,beta_02,mean_02,var_02);
  relu(this_03,weight_02->pbias);
  conv_mergeInit(this_04,this_00,this_03,(pBox *)0x0,(pBox *)0x0);
  conv_merge(this_04,this_00,this_03,(pBox *)0x0,(pBox *)0x0);
  convolutionInit(weight_03,this_04,this_05);
  convolution(weight_03,this_04,this_05);
  addbias(this_05,weight_03->pbias);
  mulandaddInit(input,this_05,output);
  mulandadd(input,this_05,output,scale);
  relu(output,weight_04->pbias);
  freepBox(this_00);
  freepBox(this_01);
  freepBox(this_02);
  freepBox(this_03);
  freepBox(this_04);
  freepBox(this_05);
  freeWeight(weight);
  freeWeight(weight_00);
  freeWeight(weight_01);
  freeWeight(weight_02);
  freeWeight(weight_03);
  freeWeight(weight_04);
  freeBN(var);
  freeBN(mean);
  freeBN(beta);
  freeBN(var_00);
  freeBN(mean_00);
  freeBN(beta_00);
  freeBN(var_01);
  freeBN(mean_01);
  freeBN(beta_01);
  freeBN(var_02);
  freeBN(mean_02);
  freeBN(beta_02);
  return;
}

Assistant:

void facenet::Inception_resnet_C(pBox *input, pBox *output, string filepath, float scale) {
    pBox *conv1_out = new pBox;
    pBox *conv2_out = new pBox;
    pBox *conv3_out = new pBox;
    pBox *conv4_out = new pBox;
    pBox *conv5_out = new pBox;
    pBox *conv6_out = new pBox;

    struct Weight *conv1_wb = new Weight;
    struct Weight *conv2_wb = new Weight;
    struct Weight *conv3_wb = new Weight;
    struct Weight *conv4_wb = new Weight;
    struct Weight *conv5_wb = new Weight;
    struct Weight *conv6_wb = new Weight;

    struct BN *conv1_var = new BN;
    struct BN *conv1_mean = new BN;
    struct BN *conv1_beta = new BN;
    struct BN *conv2_var = new BN;
    struct BN *conv2_mean = new BN;
    struct BN *conv2_beta = new BN;
    struct BN *conv3_var = new BN;
    struct BN *conv3_mean = new BN;
    struct BN *conv3_beta = new BN;
    struct BN *conv4_var = new BN;
    struct BN *conv4_mean = new BN;
    struct BN *conv4_beta = new BN;


    long conv1 = ConvAndFcInit(conv1_wb, 192, 1792, 1, 1, 0);
    BatchNormInit(conv1_beta, conv1_mean, conv1_var, 192);
    long conv2 = ConvAndFcInit(conv2_wb, 192, 1792, 1, 1, 0);
    BatchNormInit(conv2_beta, conv2_mean, conv2_var, 192);
    long conv3 = ConvAndFcInit(conv3_wb, 192, 192, 0, 1, -1, 3, 1, 1, 0);
    BatchNormInit(conv3_beta, conv3_mean, conv3_var, 192);
    long conv4 = ConvAndFcInit(conv4_wb, 192, 192, 0, 1, -1, 1, 3, 0, 1);
    BatchNormInit(conv4_beta, conv4_mean, conv4_var, 192);

    long conv5 = ConvAndFcInit(conv5_wb, 1792, 384, 1, 1, 0);

    long conv6 = ConvAndFcInit(conv6_wb, 1792, 0, 0, 0, 0);

    long dataNumber[20] = {conv1, 192, 192, 192, conv2, 192, 192, 192, conv3, 192, 192, 192, conv4, 192, 192, 192,
                           conv5, 1792, conv6, 0};


//    mydataFmt *pointTeam[20] = {
//                            conv1_wb->pdata, conv1_var->pdata, conv1_mean->pdata, conv1_beta->pdata, \
//                            conv2_wb->pdata, conv2_var->pdata, conv2_mean->pdata, conv2_beta->pdata, \
//                            conv3_wb->pdata, conv3_var->pdata, conv3_mean->pdata, conv3_beta->pdata, \
//                            conv4_wb->pdata, conv4_var->pdata, conv4_mean->pdata, conv4_beta->pdata, \
//                            conv5_wb->pdata, conv5_wb->pbias, \
//                            conv6_wb->pdata, conv6_wb->pbias};
    mydataFmt *pointTeam[20] = {
                            conv1_wb->pdata, conv1_beta->pdata, conv1_mean->pdata, conv1_var->pdata, \
                            conv2_wb->pdata, conv2_beta->pdata, conv2_mean->pdata, conv2_var->pdata, \
                            conv3_wb->pdata, conv3_beta->pdata, conv3_mean->pdata, conv3_var->pdata, \
                            conv4_wb->pdata, conv4_beta->pdata, conv4_mean->pdata, conv4_var->pdata, \
                            conv5_wb->pdata, conv5_wb->pbias, \
                            conv6_wb->pdata, conv6_wb->pbias};

//    string filename = "../model_128/Repeat_2_list.txt";
//    int length = sizeof(dataNumber) / sizeof(*dataNumber);
    readData(filepath, dataNumber, pointTeam, 20);

    convolutionInit(conv1_wb, input, conv1_out);
    //conv1 8 x 8 x 192
    convolution(conv1_wb, input, conv1_out);
    BatchNorm(conv1_out, conv1_beta, conv1_mean, conv1_var);
    relu(conv1_out, conv1_wb->pbias);

    convolutionInit(conv2_wb, input, conv2_out);
    //conv2 8 x 8 x 192
    convolution(conv2_wb, input, conv2_out);
    BatchNorm(conv2_out, conv2_beta, conv2_mean, conv2_var);
    relu(conv2_out, conv2_wb->pbias);

    convolutionInit(conv3_wb, conv2_out, conv3_out);
    //conv3 8 x 8 x 192
    convolution(conv3_wb, conv2_out, conv3_out);
    BatchNorm(conv3_out, conv3_beta, conv3_mean, conv3_var);
    relu(conv3_out, conv3_wb->pbias);

    convolutionInit(conv4_wb, conv3_out, conv4_out);
    //conv4 8 x 8 x 192
    convolution(conv4_wb, conv3_out, conv4_out);
    BatchNorm(conv4_out, conv4_beta, conv4_mean, conv4_var);
    relu(conv4_out, conv4_wb->pbias);

    conv_mergeInit(conv5_out, conv1_out, conv4_out);
    // 8*8*384
    conv_merge(conv5_out, conv1_out, conv4_out);

    convolutionInit(conv5_wb, conv5_out, conv6_out);
    //conv5 8 x 8 x 1792
    convolution(conv5_wb, conv5_out, conv6_out);
    addbias(conv6_out, conv5_wb->pbias);

    mulandaddInit(input, conv6_out, output);
    mulandadd(input, conv6_out, output, scale);
    relu(output, conv6_wb->pbias);

    freepBox(conv1_out);
    freepBox(conv2_out);
    freepBox(conv3_out);
    freepBox(conv4_out);
    freepBox(conv5_out);
    freepBox(conv6_out);

    freeWeight(conv1_wb);
    freeWeight(conv2_wb);
    freeWeight(conv3_wb);
    freeWeight(conv4_wb);
    freeWeight(conv5_wb);
    freeWeight(conv6_wb);

    freeBN(conv1_var);
    freeBN(conv1_mean);
    freeBN(conv1_beta);
    freeBN(conv2_var);
    freeBN(conv2_mean);
    freeBN(conv2_beta);
    freeBN(conv3_var);
    freeBN(conv3_mean);
    freeBN(conv3_beta);
    freeBN(conv4_var);
    freeBN(conv4_mean);
    freeBN(conv4_beta);
}